

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall flatbuffers::ToStringVisitor::Float(ToStringVisitor *this,float x)

{
  string local_38;
  float local_14;
  ToStringVisitor *pTStack_10;
  float x_local;
  ToStringVisitor *this_local;
  
  local_14 = x;
  pTStack_10 = this;
  NumToString<float>(&local_38,x);
  std::__cxx11::string::operator+=((string *)&this->s,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Float(float x) { s += NumToString(x); }